

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

Memory __thiscall
google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this,size_t *space_allocated)

{
  void *pvVar1;
  _func_void_void_ptr_size_t *p_Var2;
  SerialArena *this_00;
  GetDeallocator deallocator;
  Memory MVar3;
  
  if ((*(ulong *)(this + 8) & 0xfffffffffffffff8) == 0) {
    p_Var2 = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    p_Var2 = *(_func_void_void_ptr_size_t **)((*(ulong *)(this + 8) & 0xfffffffffffffff8) + 0x18);
  }
  this_00 = *(SerialArena **)(this + 0x10);
  if (this_00 == (SerialArena *)0x0) {
    MVar3 = (Memory)ZEXT816(0);
  }
  else {
    MVar3 = (Memory)ZEXT816(0);
    do {
      pvVar1 = MVar3.ptr;
      if (pvVar1 != (void *)0x0) {
        if (p_Var2 == (_func_void_void_ptr_size_t *)0x0) {
          operator_delete(pvVar1);
        }
        else {
          (*p_Var2)(pvVar1,MVar3.size);
        }
        *space_allocated = *space_allocated + MVar3.size;
      }
      deallocator.space_allocated_ = space_allocated;
      deallocator.dealloc_ = p_Var2;
      MVar3 = SerialArena::Free<google::protobuf::internal::GetDeallocator>(this_00,deallocator);
      this_00 = this_00->next_;
    } while (this_00 != (SerialArena *)0x0);
  }
  return MVar3;
}

Assistant:

SerialArena::Memory ThreadSafeArena::Free(size_t* space_allocated) {
  SerialArena::Memory mem = {nullptr, 0};
  auto deallocator = GetDeallocator(alloc_policy_.get(), space_allocated);
  PerSerialArena([deallocator, &mem](SerialArena* a) {
    if (mem.ptr) deallocator(mem);
    mem = a->Free(deallocator);
  });
  return mem;
}